

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpArgument
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_int arg_index,size_t size,
          void *pBuffer)

{
  uint in_ECX;
  long in_RDX;
  ulong in_RSI;
  CLIntercept *in_RDI;
  long in_R9;
  char argName [256];
  char enqueueCount [256];
  string fileName;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffd18;
  lock_guard<std::mutex> *in_stack_fffffffffffffd20;
  char *pcVar1;
  allocator *fileName_00;
  char local_2b8 [8];
  string *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  cl_kernel in_stack_fffffffffffffd60;
  CLIntercept *in_stack_fffffffffffffd68;
  string local_1b8 [32];
  char local_198 [248];
  size_t in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  string local_90 [7];
  undefined1 in_stack_ffffffffffffff77;
  string *in_stack_ffffffffffffff78;
  CLIntercept *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [40];
  long local_30;
  uint local_1c;
  ulong local_10;
  
  if (in_RDX != 0) {
    local_30 = in_R9;
    local_1c = in_ECX;
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    fileName_00 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"",fileName_00);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    OS(in_RDI);
    pcVar1 = sc_DumpDirectoryName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar1,(allocator *)&stack0xffffffffffffff6f);
    ::OS::Services_Common::GetDumpDirectoryName
              ((Services_Common *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::operator+=(local_58,"/SetKernelArg/");
    OS(in_RDI);
    ::OS::Services_Common::MakeDumpDirectories((Services_Common *)in_RDI,(string *)fileName_00);
    snprintf(local_198,0x100,"%04u",local_10 & 0xffffffff);
    std::__cxx11::string::operator+=(local_58,"SetKernelArg_");
    std::__cxx11::string::operator+=(local_58,local_198);
    std::__cxx11::string::operator+=(local_58,"_Kernel_");
    getShortKernelName_abi_cxx11_(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::operator+=(local_58,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    snprintf(local_2b8,0x100,"%d",(ulong)local_1c);
    std::__cxx11::string::operator+=(local_58,"_Arg_");
    std::__cxx11::string::operator+=(local_58,local_2b8);
    std::__cxx11::string::operator+=(local_58,".bin");
    if (local_30 != 0) {
      dumpMemoryToFile(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       (bool)in_stack_ffffffffffffff77,in_stack_ffffffffffffff68,
                       in_stack_ffffffffffffff60);
    }
    std::__cxx11::string::~string(local_58);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x211bcc);
  }
  return;
}

Assistant:

void CLIntercept::dumpArgument(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_int arg_index,
    size_t size,
    const void *pBuffer )
{
    if( kernel )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/SetKernelArg/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );
            fileName += "SetKernelArg_";
            fileName += enqueueCount;
        }

        // Add the kernel name to the file name
        {
            fileName += "_Kernel_";
            fileName += getShortKernelName(kernel);
        }

        // Add the arg number to the file name
        {
            char    argName[ MAX_PATH ];

            CLI_SPRINTF( argName, MAX_PATH, "%d", arg_index );

            fileName += "_Arg_";
            fileName += argName;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        if( pBuffer != NULL)
        {
            dumpMemoryToFile(
                fileName,
                false,
                pBuffer,
                size );
        }
    }
}